

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall duckdb_parquet::IntType::write(IntType *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"IntType");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"bitWidth",3,1);
  iVar3 = (*this_00->_vptr_TProtocol[0x10])(this_00,(ulong)(uint)(int)this->bitWidth);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"isSigned",2,2);
  iVar6 = (*this_00->_vptr_TProtocol[0xf])(this_00,(ulong)this->isSigned);
  iVar7 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar8 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar9 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar8 + iVar9 + iVar5 + iVar6 + iVar7 + iVar3 + iVar4 + iVar2 + iVar1);
}

Assistant:

uint32_t IntType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("IntType");

  xfer += oprot->writeFieldBegin("bitWidth", ::apache::thrift::protocol::T_BYTE, 1);
  xfer += oprot->writeByte(this->bitWidth);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("isSigned", ::apache::thrift::protocol::T_BOOL, 2);
  xfer += oprot->writeBool(this->isSigned);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}